

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O1

void __thiscall
TPZCompElHDiv<pzshape::TPZShapePrism>::TPZCompElHDiv
          (TPZCompElHDiv<pzshape::TPZShapePrism> *this,TPZCompMesh *mesh,TPZGeoEl *gel,
          HDivFamily hdivfam)

{
  IntruleType *this_00;
  undefined1 auVar1 [16];
  int iVar2;
  int iVar3;
  undefined4 uVar4;
  long lVar5;
  int64_t nelem;
  TPZConnect *pTVar6;
  TPZGeoEl *this_01;
  long *plVar7;
  undefined1 auVar8 [16];
  int order_1;
  TPZManVector<int,_3> order;
  TPZManVector<int,_3> ord;
  TPZStack<int,_10> facesides;
  int local_ec;
  TPZVec<int> local_e8;
  int local_c8;
  int local_c4;
  int local_c0;
  pointer_____offset_0x60___ *local_b8;
  TPZManVector<int,_5> *local_b0;
  TPZManVector<int,_3> local_a8;
  TPZManVector<int,_10> local_78;
  long lVar9;
  
  *(undefined ***)
   &(this->super_TPZIntelGen<pzshape::TPZShapePrism>).super_TPZInterpolatedElement.
    super_TPZInterpolationSpace.super_TPZCompEl = &PTR__TPZSavable_01927498;
  TPZIntelGen<pzshape::TPZShapePrism>::TPZIntelGen
            (&this->super_TPZIntelGen<pzshape::TPZShapePrism>,&PTR_PTR_01922438,mesh,gel,1);
  *(undefined ***)
   &(this->super_TPZIntelGen<pzshape::TPZShapePrism>).super_TPZInterpolatedElement.
    super_TPZInterpolationSpace.super_TPZCompEl = &PTR__TPZCompElHDiv_01922060;
  local_b0 = &this->fSideOrient;
  TPZVec<int>::TPZVec(&local_b0->super_TPZVec<int>,0);
  (this->fSideOrient).super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  (this->fSideOrient).super_TPZVec<int>.fStore = (this->fSideOrient).fExtAlloc;
  (this->fSideOrient).super_TPZVec<int>.fNElements = 5;
  (this->fSideOrient).super_TPZVec<int>.fNAlloc = 0;
  auVar1 = _DAT_014f8350;
  lVar5 = 0x25;
  auVar8 = _DAT_014f8340;
  do {
    if (SUB164(auVar8 ^ auVar1,4) == -0x80000000 && SUB164(auVar8 ^ auVar1,0) < -0x7ffffffb) {
      *(undefined4 *)((long)this + lVar5 * 4 + -4) = 1;
      *(undefined4 *)
       (&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).super_TPZInterpolatedElement.
         super_TPZInterpolationSpace.super_TPZCompEl.field_0x0 + lVar5 * 4) = 1;
    }
    lVar9 = auVar8._8_8_;
    auVar8._0_8_ = auVar8._0_8_ + 2;
    auVar8._8_8_ = lVar9 + 2;
    lVar5 = lVar5 + 2;
  } while (lVar5 != 0x2b);
  (this->fRestraints).super__List_base<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->fRestraints;
  (this->fRestraints).super__List_base<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->fRestraints;
  (this->fRestraints).super__List_base<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>.
  _M_impl._M_node._M_size = 0;
  TPZVec<long>::TPZVec(&(this->fConnectIndexes).super_TPZVec<long>,0);
  (this->fConnectIndexes).super_TPZVec<long>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_018b5098;
  (this->fConnectIndexes).super_TPZVec<long>.fStore = (this->fConnectIndexes).fExtAlloc;
  (this->fConnectIndexes).super_TPZVec<long>.fNElements = 6;
  (this->fConnectIndexes).super_TPZVec<long>.fNAlloc = 0;
  *(undefined4 *)(this->fConnectIndexes).fExtAlloc = 0xffffffff;
  *(undefined4 *)((long)(this->fConnectIndexes).fExtAlloc + 4) = 0xffffffff;
  *(undefined4 *)((this->fConnectIndexes).fExtAlloc + 1) = 0xffffffff;
  *(undefined4 *)((long)(this->fConnectIndexes).fExtAlloc + 0xc) = 0xffffffff;
  *(undefined4 *)((this->fConnectIndexes).fExtAlloc + 2) = 0xffffffff;
  *(undefined4 *)((long)(this->fConnectIndexes).fExtAlloc + 0x14) = 0xffffffff;
  *(undefined4 *)((this->fConnectIndexes).fExtAlloc + 3) = 0xffffffff;
  *(undefined4 *)((long)(this->fConnectIndexes).fExtAlloc + 0x1c) = 0xffffffff;
  *(undefined4 *)((this->fConnectIndexes).fExtAlloc + 4) = 0xffffffff;
  *(undefined4 *)((long)(this->fConnectIndexes).fExtAlloc + 0x24) = 0xffffffff;
  *(undefined4 *)((this->fConnectIndexes).fExtAlloc + 5) = 0xffffffff;
  *(undefined4 *)((long)(this->fConnectIndexes).fExtAlloc + 0x2c) = 0xffffffff;
  this->fhdivfam = hdivfam;
  (this->super_TPZIntelGen<pzshape::TPZShapePrism>).super_TPZInterpolatedElement.
  super_TPZInterpolationSpace.fPreferredOrder = mesh->fDefaultOrder;
  TPZManVector<long,_6>::Resize(&this->fConnectIndexes,6);
  gel->fReference = (TPZCompEl *)this;
  TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)&local_78);
  pztopology::TPZPrism::LowerDimensionSides(0x14,(TPZStack<int,_10> *)&local_78,2);
  TPZStack<int,_10>::Push((TPZStack<int,_10> *)&local_78,0x14);
  if (0 < local_78.super_TPZVec<int>.fNElements) {
    lVar5 = 0;
    do {
      iVar2 = local_78.super_TPZVec<int>.fStore[lVar5];
      nelem = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                     super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                     super_TPZCompEl + 0x370))(this,iVar2);
      (this->fConnectIndexes).super_TPZVec<long>.fStore[lVar5] = nelem;
      pTVar6 = TPZChunkVector<TPZConnect,_10>::operator[]
                         (&(mesh->fConnectVec).super_TPZChunkVector<TPZConnect,_10>,nelem);
      pTVar6->fNElConnected = pTVar6->fNElConnected + 1;
      (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                             super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                             super_TPZCompEl + 0x378))(this,iVar2);
      lVar5 = lVar5 + 1;
    } while (lVar5 < local_78.super_TPZVec<int>.fNElements);
  }
  iVar2 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                 super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                 super_TPZCompEl + 0x338))(this);
  this_00 = &(this->super_TPZIntelGen<pzshape::TPZShapePrism>).fIntRule;
  iVar3 = TPZIntPrism3D::GetMaxOrder(this_00);
  iVar2 = iVar2 * 2 + 2;
  if (iVar3 < iVar2) {
    iVar2 = TPZIntPrism3D::GetMaxOrder(this_00);
  }
  local_b8 = &PTR_PTR_01922438;
  TPZVec<int>::TPZVec(&local_e8,0);
  local_e8._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018437d0;
  local_e8.fNElements = 3;
  local_e8.fNAlloc = 0;
  local_e8.fStore = &local_c8;
  local_c8 = iVar2;
  local_c4 = iVar2;
  local_c0 = iVar2;
  TPZIntPrism3D::SetOrder(this_00,&local_e8,0);
  lVar5 = 0;
  do {
    this_01 = TPZCompEl::Reference((TPZCompEl *)this);
    iVar2 = TPZGeoEl::NormalOrientation(this_01,(int)lVar5 + 0xf);
    (this->fSideOrient).super_TPZVec<int>.fStore[lVar5] = iVar2;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 5);
  lVar5 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                 super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                 super_TPZCompEl + 0xb8))(this);
  if (lVar5 == 0) {
    plVar7 = (long *)0x0;
  }
  else {
    plVar7 = (long *)__dynamic_cast(lVar5,&TPZMaterial::typeinfo,&TPZMatSingleSpace::typeinfo,
                                    0xfffffffffffffffe);
  }
  if (plVar7 != (long *)0x0) {
    uVar4 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                   super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                   super_TPZCompEl + 0x268))(this);
    local_ec = (**(code **)(*plVar7 + 0x58))(plVar7,uVar4);
    iVar2 = (**(code **)(*(long *)gel + 0x210))(gel);
    TPZManVector<int,_3>::TPZManVector(&local_a8,(long)iVar2,&local_ec);
    TPZIntPrism3D::SetOrder(this_00,&local_a8.super_TPZVec<int>,0);
    if (local_a8.super_TPZVec<int>.fStore == local_a8.fExtAlloc) {
      local_a8.super_TPZVec<int>.fStore = (int *)0x0;
    }
    local_a8.super_TPZVec<int>.fNAlloc = 0;
    local_a8.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
    if (local_a8.super_TPZVec<int>.fStore != (int *)0x0) {
      operator_delete__(local_a8.super_TPZVec<int>.fStore);
    }
  }
  if (local_e8.fStore == &local_c8) {
    local_e8.fStore = (int *)0x0;
  }
  local_e8.fNAlloc = 0;
  local_e8._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
  if (local_e8.fStore != (int *)0x0) {
    operator_delete__(local_e8.fStore);
  }
  TPZManVector<int,_10>::~TPZManVector(&local_78);
  return;
}

Assistant:

TPZCompElHDiv<TSHAPE>::TPZCompElHDiv(TPZCompMesh &mesh, TPZGeoEl *gel, const HDivFamily hdivfam) :
TPZRegisterClassId(&TPZCompElHDiv::ClassId),
TPZIntelGen<TSHAPE>(mesh,gel,1), fSideOrient(TSHAPE::NFacets,1), fhdivfam(hdivfam) {
	this->TPZInterpolationSpace::fPreferredOrder = mesh.GetDefaultOrder();
	int nconflux= TPZCompElHDiv::NConnects();
    this->fConnectIndexes.Resize(nconflux);
	gel->SetReference(this);

//    int nfaces = TSHAPE::NumSides(TSHAPE::Dimension-1);
    TPZStack<int> facesides;
    TSHAPE::LowerDimensionSides(TSHAPE::NSides-1,facesides,TSHAPE::Dimension-1);
    facesides.Push(TSHAPE::NSides-1);
	for(int i=0;i< facesides.size(); i++)
	{
        int sideaux= facesides[i];
		this->fConnectIndexes[i] = this->CreateMidSideConnect(sideaux);
#ifdef PZ_LOG
        if (logger.isDebugEnabled())
        {
            std::stringstream sout;
            sout << "After creating last flux connect " << i << std::endl;
            //	this->Print(sout);
            LOGPZ_DEBUG(logger,sout.str())
        }
#endif

		mesh.ConnectVec()[this->fConnectIndexes[i]].IncrementElConnected();
		this->IdentifySideOrder(sideaux);
    }


    int sideorder = EffectiveSideOrder(TSHAPE::NSides-1);
//    if(TSHAPE::Type()==EQuadrilateral)
//    {
//        sideorder++;
//    }

    sideorder++;

	sideorder = 2*sideorder;
	if (sideorder > this->fIntRule.GetMaxOrder()) sideorder = this->fIntRule.GetMaxOrder();
	TPZManVector<int,3> order(3,sideorder);
	this->fIntRule.SetOrder(order);
    int firstside = TSHAPE::NSides-TSHAPE::NFacets-1;
    for(int side = firstside ; side < TSHAPE::NSides-1; side++ )
    {
        fSideOrient[side-firstside] = this->Reference()->NormalOrientation(side);
    }
    auto *mat =
        dynamic_cast<TPZMatSingleSpace *>(this->Material());
    if (mat)
    {
        int order = mat->IntegrationRuleOrder(MaxOrder());
        TPZManVector<int,3> ord(gel->Dimension(),order);
        this->fIntRule.SetOrder(ord);
    }

    if (fhdivfam == HDivFamily::EHDivConstant) {
        // For HDiv constant, polynomial order was compatibilized in connectorders, 
        // see TPZShapeHDivConstant<TSHAPE>::Initialize. So now we need to update
        // the number of shape functions and also the integration rule
        if (TSHAPE::Type() == ETriangle || TSHAPE::Type() == EQuadrilateral || TSHAPE::Type() == ETetraedro){
            for (int icon = 0; icon < this->NConnects(); icon++)
            {
                TPZConnect &c = this->Connect(icon);
                int nShapeF = NConnectShapeF(icon,c.Order());
                if (c.NShape() != nShapeF){
                    DebugStop();
                }
            }
        }
    }
}